

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O3

void __thiscall
s2shapeutil::anon_unknown_0::IndexCrosser::IndexCrosser
          (IndexCrosser *this,S2ShapeIndex *a_index,S2ShapeIndex *b_index,CrossingType type,
          EdgePairVisitor *visitor,bool swapped)

{
  this->a_index_ = a_index;
  this->b_index_ = b_index;
  this->visitor_ = visitor;
  this->min_crossing_sign_ = (uint)(type == INTERIOR);
  this->swapped_ = swapped;
  (this->b_query_).tmp_candidates_.
  super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->b_query_).tmp_candidates_.
  super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->b_query_).tmp_candidates_.
  super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->b_query_).index_ = (S2ShapeIndex *)0x0;
  (this->b_query_).a0_.c_[0] = 0.0;
  (this->b_query_).a0_.c_[1] = 0.0;
  (this->b_query_).a1_.c_[0] = 0.0;
  (this->b_query_).a1_.c_[1] = 0.0;
  (this->b_query_).iter_.iter_._M_t.
  super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl = (IteratorBase *)0x0;
  S2CrossingEdgeQuery::Init(&this->b_query_,b_index);
  (this->b_shape_edges_).allocator_and_tag_.tag_.size_ = 0;
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->a_shape_edges_).allocator_and_tag_.tag_.size_ = 0;
  return;
}

Assistant:

IndexCrosser(const S2ShapeIndex& a_index, const S2ShapeIndex& b_index,
               CrossingType type, const EdgePairVisitor& visitor, bool swapped)
      : a_index_(a_index), b_index_(b_index), visitor_(visitor),
        min_crossing_sign_(type == CrossingType::INTERIOR ? 1 : 0),
        swapped_(swapped), b_query_(&b_index_) {
  }